

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memleak.cc
# Opt level: O3

void * memleak_realloc(void *ptr,size_t size)

{
  avl_node *paVar1;
  avl_node *paVar2;
  void *pvVar3;
  avl_node *node;
  undefined8 *puVar4;
  memleak_item query;
  avl_node local_48;
  
  pvVar3 = realloc(ptr,size);
  if ((pvVar3 != (void *)0x0) && ((start_sw & 1) != 0)) {
    pthread_spin_lock(&lock);
    node = avl_search(&tree_index,&local_48,memleak_cmp);
    if (node != (avl_node *)0x0) {
      avl_remove(&tree_index,node);
      paVar1 = node[-1].parent;
      paVar2 = node[-1].right;
      puVar4 = (undefined8 *)malloc(0x38);
      *puVar4 = pvVar3;
      puVar4[1] = paVar1;
      puVar4[3] = paVar2;
      puVar4[2] = size;
      avl_insert(&tree_index,(avl_node *)(puVar4 + 4),memleak_cmp);
      free(&node[-2].right);
    }
    pthread_spin_unlock(&lock);
  }
  return pvVar3;
}

Assistant:

LIBMEMLEAK_API
void *memleak_realloc(void *ptr, size_t size)
{

    void *addr = (void *)realloc(ptr, size);
    if (addr && start_sw) {
        spin_lock(&lock);
        struct avl_node *a;
        struct memleak_item *item, query;

        query.addr = (uint64_t)ptr;
        a = avl_search(&tree_index, &query.avl, memleak_cmp);
        if (a) {
            item = _get_entry(a, struct memleak_item, avl);
            DBG("realloc from address 0x%016lx (allocated at %s:%ld, size %ld)\n\tto address 0x%016lx (size %ld)\n",
                item->addr, item->file, item->line, item->size, (uint64_t)addr, size);
            avl_remove(&tree_index, a);
            _memleak_add_to_index(addr, size, item->file, item->line, 0);
#ifdef _STACK_BACKTRACE
            free(item->btrace);
#endif
            free(item);
        }
        spin_unlock(&lock);
    }

    return addr;
}